

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

void C_BackupCVars(void)

{
  FBaseCVar *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  FBaseCVar **ppFVar3;
  FCVarBackup backup;
  
  if (CVarBackups.Count == 0) {
    TArray<FCVarBackup,_FCVarBackup>::Clear(&CVarBackups);
    backup.Name.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 2;
    backup.String.Chars = FString::NullString.Nothing;
    ppFVar3 = &CVars;
    while (pFVar1 = *ppFVar3, pFVar1 != (FBaseCVar *)0x0) {
      if ((char)((pFVar1->Flags & 0x10) >> 4) == '\0' && (pFVar1->Flags & 0x44) != 0) {
        FString::operator=(&backup.Name,pFVar1->Name);
        iVar2 = (*pFVar1->_vptr_FBaseCVar[4])(pFVar1,3);
        FString::operator=(&backup.String,(char *)CONCAT44(extraout_var,iVar2));
        TArray<FCVarBackup,_FCVarBackup>::Push(&CVarBackups,&backup);
      }
      ppFVar3 = &pFVar1->m_Next;
    }
    FCVarBackup::~FCVarBackup(&backup);
    return;
  }
  __assert_fail("CVarBackups.Size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/c_cvars.cpp"
                ,0x588,"void C_BackupCVars()");
}

Assistant:

void C_BackupCVars (void)
{
	assert(CVarBackups.Size() == 0);
	CVarBackups.Clear();

	FCVarBackup backup;

	for (FBaseCVar *cvar = CVars; cvar != NULL; cvar = cvar->m_Next)
	{
		if ((cvar->Flags & (CVAR_SERVERINFO|CVAR_DEMOSAVE)) && !(cvar->Flags & CVAR_LATCH))
		{
			backup.Name = cvar->GetName();
			backup.String = cvar->GetGenericRep(CVAR_String).String;
			CVarBackups.Push(backup);
		}
	}
}